

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenStructBody
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *writer,char *nameprefix)

{
  FieldDef *__lhs;
  StructDef *struct_def_00;
  Type type;
  Type *type_00;
  pointer ppFVar1;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed8;
  string local_120;
  string local_100;
  KotlinGenerator *local_e0;
  char *local_d8;
  IdlNamer *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  _Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  local_e0 = this;
  local_d8 = nameprefix;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"align",(allocator<char> *)&local_c8);
  NumToString<unsigned_long>(&local_100,struct_def->minalign);
  CodeWriter::SetValue(writer,&local_120,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"size",(allocator<char> *)&local_c8);
  NumToString<unsigned_long>(&local_100,struct_def->bytesize);
  CodeWriter::SetValue(writer,&local_120,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"builder.prep({{align}}, {{size}})",(allocator<char> *)&local_120);
  CodeWriter::operator+=(writer,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&local_a8,
             &(struct_def->fields).vec);
  local_d0 = &local_e0->namer_;
  ppFVar1 = local_a8._M_impl.super__Vector_impl_data._M_finish;
  while (ppFVar1 != local_a8._M_impl.super__Vector_impl_data._M_start) {
    __lhs = ppFVar1[-1];
    if (__lhs->padding != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"pad",(allocator<char> *)&local_c8);
      NumToString<unsigned_long>(&local_100,__lhs->padding);
      CodeWriter::SetValue(writer,&local_120,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"builder.pad({{pad}})",(allocator<char> *)&local_120);
      CodeWriter::operator+=(writer,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    ppFVar1 = ppFVar1 + -1;
    if (((__lhs->value).type.base_type == BASE_TYPE_STRUCT) &&
       (struct_def_00 = (__lhs->value).type.struct_def, struct_def_00->fixed == true)) {
      std::operator+(&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,"_")
      ;
      std::operator+(&local_120,local_d8,&local_100);
      GenStructBody(local_e0,struct_def_00,writer,local_120._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"type",(allocator<char> *)&local_c8);
      GenMethod_abi_cxx11_(&local_100,(KotlinGenerator *)&__lhs->value,type_00);
      CodeWriter::SetValue(writer,&local_120,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"argname",(allocator<char> *)&stack0xfffffffffffffedf);
      (*(local_d0->super_Namer)._vptr_Namer[7])(&local_c8,local_d0,__lhs);
      std::operator+(&local_100,local_d8,&local_c8);
      CodeWriter::SetValue(writer,&local_120,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"cast",(allocator<char> *)&local_c8);
      type.struct_def = (StructDef *)in_stack_fffffffffffffec8;
      type._0_8_ = *(undefined8 *)&(__lhs->value).type.fixed_length;
      type.enum_def = (EnumDef *)writer;
      type._24_8_ = in_stack_fffffffffffffed8;
      CastToSigned_abi_cxx11_(type);
      CodeWriter::SetValue(writer,&local_120,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"builder.put{{type}}({{argname}}{{cast}})",
                 (allocator<char> *)&local_120);
      CodeWriter::operator+=(writer,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  std::_Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
  ~_Vector_base(&local_a8);
  return;
}

Assistant:

void GenStructBody(const StructDef &struct_def, CodeWriter &writer,
                     const char *nameprefix) const {
    writer.SetValue("align", NumToString(struct_def.minalign));
    writer.SetValue("size", NumToString(struct_def.bytesize));
    writer += "builder.prep({{align}}, {{size}})";
    auto fields_vec = struct_def.fields.vec;
    for (auto it = fields_vec.rbegin(); it != fields_vec.rend(); ++it) {
      auto &field = **it;

      if (field.padding) {
        writer.SetValue("pad", NumToString(field.padding));
        writer += "builder.pad({{pad}})";
      }
      if (IsStruct(field.value.type)) {
        GenStructBody(*field.value.type.struct_def, writer,
                      (nameprefix + (field.name + "_")).c_str());
      } else {
        writer.SetValue("type", GenMethod(field.value.type));
        writer.SetValue("argname", nameprefix + namer_.Variable(field));
        writer.SetValue("cast", CastToSigned(field.value.type));
        writer += "builder.put{{type}}({{argname}}{{cast}})";
      }
    }
  }